

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,Statement *stmt)

{
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RDI;
  DataFlowState *in_stack_ffffffffffffff28;
  
  DataFlowAnalysis::topState((DataFlowAnalysis *)&stack0xffffffffffffff50);
  DataFlowState::operator=((DataFlowState *)in_RDI,in_stack_ffffffffffffff28);
  DataFlowState::~DataFlowState((DataFlowState *)0x7ec095);
  visit<slang::ast::Statement>(in_RDI,(Statement *)in_stack_ffffffffffffff28);
  return;
}

Assistant:

void run(const Statement& stmt) {
        state = (DERIVED).topState();
        visit(stmt);
    }